

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

Test * __thiscall
testing::internal::TestFactoryImpl<(anonymous_namespace)::CpuZeropageIndexedTest_adc_zero_x_Test>::
CreateTest(TestFactoryImpl<(anonymous_namespace)::CpuZeropageIndexedTest_adc_zero_x_Test> *this)

{
  CpuTest *this_00;
  
  this_00 = (CpuTest *)operator_new(0x118);
  n_e_s::core::test::CpuTest::CpuTest(this_00);
  *(undefined2 *)&this_00->field_0x112 = 0x4321;
  *(undefined4 *)&this_00->field_0x114 = 0x44ed39;
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__CpuTest_002aa7b8;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }